

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexWriter.cpp
# Opt level: O2

Res __thiscall Ptex::v2_2::PtexWriterBase::calcTileRes(PtexWriterBase *this,Res faceres)

{
  uint32_t uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  
  uVar1 = PtexUtils::floor_log2
                    ((((1 << (faceres.ulog2 & 0x1fU)) << (faceres.vlog2 & 0x1fU)) * this->_pixelSize
                     ) / 0x10000);
  uVar6 = (uint)((ushort)faceres >> 8);
  if (uVar1 != 0) {
    iVar4 = (int)faceres.ulog2;
    uVar3 = (uint)faceres.vlog2;
    iVar5 = (uVar3 + iVar4) - uVar1;
    iVar2 = (iVar5 + 1) / 2;
    if (iVar2 < iVar4) {
      iVar4 = iVar2;
    }
    faceres = SUB42(iVar4,0);
    uVar6 = iVar5 - (char)iVar4;
    if ((int)uVar3 <= (int)uVar6) {
      uVar6 = uVar3;
    }
  }
  return (Res)((ushort)faceres & 0xff | (ushort)((uVar6 & 0xff) << 8));
}

Assistant:

Ptex::Res PtexWriterBase::calcTileRes(Res faceres)
{
    // desired number of tiles = floor(log2(facesize / tilesize))
    int facesize = faceres.size() * _pixelSize;
    int ntileslog2 = PtexUtils::floor_log2(facesize/TileSize);
    if (ntileslog2 == 0) return faceres;

    // number of tiles is defined as:
    //   ntileslog2 = ureslog2 + vreslog2 - (tile_ureslog2 + tile_vreslog2)
    // rearranging to solve for the tile res:
    //   tile_ureslog2 + tile_vreslog2 = ureslog2 + vreslog2 - ntileslog2
    int n = faceres.ulog2 + faceres.vlog2 - ntileslog2;

    // choose u and v sizes for roughly square result (u ~= v ~= n/2)
    // and make sure tile isn't larger than face
    Res tileres;
    tileres.ulog2 = (int8_t)PtexUtils::min(int((n+1)/2), int(faceres.ulog2));
    tileres.vlog2 = (int8_t)PtexUtils::min(int(n - tileres.ulog2), int(faceres.vlog2));
    return tileres;
}